

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

uint32 __thiscall
Js::JavascriptArray::GetNextIndexHelper<double>(JavascriptArray *this,uint32 index)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SparseArraySegmentBase *pSVar5;
  uint32 index_00;
  Type *pTVar6;
  uint32 uVar7;
  
  if ((this->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xae8,"(this->head)","array head should never be null");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (index == 0xffffffff) {
    index_00 = ((this->head).ptr)->left;
  }
  else {
    index_00 = index + 1;
  }
  pSVar5 = GetBeginLookupSegment(this,index_00,true);
  if (pSVar5 != (SparseArraySegmentBase *)0x0) {
    while( true ) {
      uVar1 = pSVar5->left;
      if ((uVar1 <= index_00) && (index_00 - uVar1 < pSVar5->length)) {
        pTVar6 = &pSVar5[1].left + (ulong)(index_00 - uVar1) * 2;
        uVar7 = index_00;
        do {
          if (*(undefined1 **)pTVar6 != &DAT_fff80002fff80002) {
            return uVar7;
          }
          uVar7 = uVar7 + 1;
          pTVar6 = pTVar6 + 2;
        } while (uVar1 + pSVar5->length != uVar7);
      }
      pSVar5 = (pSVar5->next).ptr;
      if (pSVar5 == (SparseArraySegmentBase *)0x0) break;
      if (index_00 <= pSVar5->left) {
        index_00 = pSVar5->left;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

uint32 JavascriptArray::GetNextIndexHelper(uint32 index) const
    {
        AssertMsg(this->head, "array head should never be null");
        uint candidateIndex;

        if (index == JavascriptArray::InvalidIndex)
        {
            candidateIndex = head->left;
        }
        else
        {
            candidateIndex = index + 1;
        }

        SparseArraySegment<T>* current = (SparseArraySegment<T>*)this->GetBeginLookupSegment(candidateIndex);

        while (current != nullptr)
        {
            if ((current->left <= candidateIndex) && ((candidateIndex - current->left) < current->length))
            {
                for (uint i = candidateIndex - current->left; i < current->length; i++)
                {
                    if (!SparseArraySegment<T>::IsMissingItem(&current->elements[i]))
                    {
                        return i + current->left;
                    }
                }
            }
            current = SparseArraySegment<T>::From(current->next);
            if (current != NULL)
            {
                if (candidateIndex < current->left)
                {
                    candidateIndex = current->left;
                }
            }
        }
        return JavascriptArray::InvalidIndex;
    }